

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameResolveTrigger(Parse *pParse,char *zDb)

{
  Table *pTVar1;
  undefined8 *in_RDI;
  ExprList *pUpsertSet;
  Upsert *pUpsert;
  SrcList sSrc;
  Table *pTarget;
  int rc;
  NameContext sNC;
  TriggerStep *pStep;
  Trigger *pNew;
  sqlite3 *db;
  undefined7 in_stack_fffffffffffffee8;
  sqlite3 *pParse_00;
  NameContext *pNC;
  Db *zName;
  sqlite3 *in_stack_ffffffffffffff08;
  long in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Table *in_stack_ffffffffffffff20;
  Parse *in_stack_ffffffffffffff28;
  int local_64;
  undefined8 *local_60;
  undefined1 *local_58;
  long local_50;
  undefined2 local_38;
  long local_28;
  long local_20;
  sqlite3 *local_18;
  undefined8 *local_8;
  
  local_18 = (sqlite3 *)*in_RDI;
  local_20 = in_RDI[0x29];
  local_64 = 0;
  local_8 = in_RDI;
  memset(&local_60,0,0x38);
  local_60 = local_8;
  pNC = *(NameContext **)(local_20 + 8);
  zName = local_18->aDb;
  pParse_00 = local_18;
  sqlite3SchemaToIndex(local_18,*(Schema **)(local_20 + 0x30));
  pTVar1 = sqlite3FindTable(in_stack_ffffffffffffff08,(char *)zName,(char *)pNC);
  local_8[0x15] = pTVar1;
  *(undefined1 *)(local_8 + 0x18) = *(undefined1 *)(local_20 + 0x10);
  if (local_8[0x15] != 0) {
    local_64 = sqlite3ViewGetColumnNames(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  if ((local_64 == 0) && (*(long *)(local_20 + 0x18) != 0)) {
    local_64 = sqlite3ResolveExprNames
                         ((NameContext *)in_stack_ffffffffffffff28,(Expr *)in_stack_ffffffffffffff20
                         );
  }
  for (local_28 = *(long *)(local_20 + 0x38); local_64 == 0 && local_28 != 0;
      local_28 = *(long *)(local_28 + 0x48)) {
    if ((*(long *)(local_28 + 0x10) != 0) &&
       (sqlite3SelectPrep((Parse *)pParse_00,
                          (Select *)
                          CONCAT17(local_64 == 0 && local_28 != 0,in_stack_fffffffffffffee8),
                          (NameContext *)0x1df245), *(int *)(local_8 + 6) != 0)) {
      local_64 = *(int *)(local_8 + 3);
    }
    if ((local_64 == 0) && (*(long *)(local_28 + 0x18) != 0)) {
      pTVar1 = sqlite3LocateTable((Parse *)CONCAT44(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18),
                                  (u32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                  (char *)in_stack_ffffffffffffff08,(char *)zName);
      if (pTVar1 == (Table *)0x0) {
        local_64 = 1;
      }
      else {
        local_64 = sqlite3ViewGetColumnNames(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        if (local_64 == 0) {
          memset(&stack0xffffffffffffff18,0,0x78);
          in_stack_ffffffffffffff18 = 1;
          local_58 = &stack0xffffffffffffff18;
          if (*(long *)(local_28 + 0x20) != 0) {
            local_64 = sqlite3ResolveExprNames
                                 ((NameContext *)in_stack_ffffffffffffff28,
                                  (Expr *)in_stack_ffffffffffffff20);
          }
          if (local_64 == 0) {
            local_64 = sqlite3ResolveExprListNames(pNC,(ExprList *)pParse_00);
          }
          if (*(long *)(local_28 + 0x38) != 0) {
            in_stack_ffffffffffffff10 = *(long *)(local_28 + 0x38);
            *(undefined1 **)(in_stack_ffffffffffffff10 + 0x28) = &stack0xffffffffffffff18;
            local_38 = 0x200;
            local_50 = in_stack_ffffffffffffff10;
            local_64 = sqlite3ResolveExprListNames(pNC,(ExprList *)pParse_00);
            if (local_64 == 0) {
              in_stack_ffffffffffffff08 = *(sqlite3 **)(in_stack_ffffffffffffff10 + 0x10);
              local_64 = sqlite3ResolveExprListNames(pNC,(ExprList *)pParse_00);
            }
            if (local_64 == 0) {
              local_64 = sqlite3ResolveExprNames
                                   ((NameContext *)in_stack_ffffffffffffff28,
                                    (Expr *)in_stack_ffffffffffffff20);
            }
            if (local_64 == 0) {
              local_64 = sqlite3ResolveExprNames
                                   ((NameContext *)in_stack_ffffffffffffff28,
                                    (Expr *)in_stack_ffffffffffffff20);
            }
            local_38 = 0;
          }
        }
      }
    }
  }
  return local_64;
}

Assistant:

static int renameResolveTrigger(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table, 
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      Table *pTarget = sqlite3LocateTable(pParse, 0, pStep->zTarget, zDb);
      if( pTarget==0 ){
        rc = SQLITE_ERROR;
      }else if( SQLITE_OK==(rc = sqlite3ViewGetColumnNames(pParse, pTarget)) ){
        SrcList sSrc;
        memset(&sSrc, 0, sizeof(sSrc));
        sSrc.nSrc = 1;
        sSrc.a[0].zName = pStep->zTarget;
        sSrc.a[0].pTab = pTarget;
        sNC.pSrcList = &sSrc;
        if( pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert ){
          Upsert *pUpsert = pStep->pUpsert;
          assert( rc==SQLITE_OK );
          pUpsert->pUpsertSrc = &sSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
      }
    }
  }
  return rc;
}